

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int parse_entry(za_file *zf,zip_entry_type type,char *name,coda_product_class *current_product_class
               ,coda_product_definition *current_product_definition)

{
  int iVar1;
  XML_Status XVar2;
  XML_Error code;
  size_t sVar3;
  char *pcVar4;
  za_entry *entry;
  hashtable *table;
  int *piVar5;
  XML_LChar *pXVar6;
  XML_Size XVar7;
  XML_Index XVar8;
  char *pcVar9;
  char *message;
  long lVar10;
  parser_info local_88;
  
  if (type == ze_product) {
    if (name == (char *)0x0) {
      __assert_fail("name != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                    ,0x1014,
                    "int parse_entry(za_file *, zip_entry_type, const char *, coda_product_class *, coda_product_definition *)"
                   );
    }
    sVar3 = strlen(name);
    pcVar4 = (char *)malloc(sVar3 + 0xe);
    if (pcVar4 == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",sVar3 + 0xe,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,0x1019);
    }
    pcVar9 = "products/%s.xml";
LAB_0012c80b:
    sprintf(pcVar4,pcVar9,name);
  }
  else {
    if (type == ze_type) {
      if (name == (char *)0x0) {
        __assert_fail("name != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                      ,0x100a,
                      "int parse_entry(za_file *, zip_entry_type, const char *, coda_product_class *, coda_product_definition *)"
                     );
      }
      sVar3 = strlen(name);
      pcVar4 = (char *)malloc(sVar3 + 0xb);
      if (pcVar4 == (char *)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",sVar3 + 0xb,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                       ,0x100f);
      }
      pcVar9 = "types/%s.xml";
      goto LAB_0012c80b;
    }
    pcVar4 = strdup("index.xml");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,0x1006);
    }
  }
  entry = coda_za_get_entry_by_name(zf,pcVar4);
  if (entry != (za_entry *)0x0) {
    free(pcVar4);
    local_88.hash_data = (hashtable *)0x0;
    local_88.node = (node_info *)0x0;
    local_88.parser = (XML_Parser)0x0;
    local_88.product_class_revision = 0;
    local_88.abort_parser = 0;
    local_88.ignore_file = 0;
    local_88.add_error_location = 1;
    local_88.unparsed_depth = 0;
    local_88.zf = zf;
    local_88.entry_base_name = name;
    local_88.product_class = current_product_class;
    local_88.product_definition = current_product_definition;
    sVar3 = coda_za_get_entry_size(entry);
    local_88.buffer = (char *)malloc(sVar3);
    if (local_88.buffer == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",sVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,0x1041);
    }
    else {
      iVar1 = coda_za_read_entry(entry,local_88.buffer);
      if (iVar1 != 0) {
LAB_0012c8d1:
        parser_info_delete(&local_88);
        return -1;
      }
      table = coda_hashtable_new(1);
      local_88.hash_data = table;
      if (table == (hashtable *)0x0) {
        coda_set_error(-1,"out of memory (could not allocate hashtable) (%s:%u)",
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                       ,0x104f);
      }
      else {
        lVar10 = 0;
        while (lVar10 != 0x158) {
          iVar1 = coda_hashtable_add_name(table,*(char **)((long)xml_full_element_name + lVar10));
          lVar10 = lVar10 + 8;
          if (iVar1 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                          ,0x1057,
                          "int parse_entry(za_file *, zip_entry_type, const char *, coda_product_class *, coda_product_definition *)"
                         );
          }
        }
        local_88.parser = coda_XML_ParserCreateNS((XML_Char *)0x0,' ');
        if (local_88.parser == (XML_Parser)0x0) {
          coda_set_error(-0xe,"could not create XML parser");
          goto LAB_0012c8d1;
        }
        coda_XML_SetUserData(local_88.parser,&local_88);
        coda_XML_SetElementHandler(local_88.parser,start_element_handler,end_element_handler);
        push_node(&local_88,no_element,(char **)0x0);
        (local_88.node)->format_set = 0;
        if (type == ze_product) {
          (local_88.node)->init_sub_element[0x1f] = cd_product_definition_sub_init;
          (local_88.node)->add_element_to_parent[0x1f] = (add_element_to_parent_handler)0x0;
        }
        else if (type == ze_type) {
          register_type_elements(local_88.node,product_class_add_named_type);
        }
        else {
          (local_88.node)->init_sub_element[0x1e] = cd_product_class_init;
          (local_88.node)->add_element_to_parent[0x1e] = data_dictionary_add_product_class;
        }
        piVar5 = (int *)__tls_get_addr(&PTR_001d8fb8);
        *piVar5 = 0;
        XVar2 = coda_XML_Parse(local_88.parser,local_88.buffer,(int)sVar3,1);
        iVar1 = *piVar5;
        if ((XVar2 != XML_STATUS_ERROR && iVar1 == 0) || (local_88.ignore_file != 0)) {
          parser_info_delete(&local_88);
          return 0;
        }
        if (iVar1 == 0) {
          code = coda_XML_GetErrorCode(local_88.parser);
          pXVar6 = coda_XML_ErrorString(code);
          coda_set_error(-400,"xml parse error: %s",pXVar6);
          iVar1 = *piVar5;
        }
        if ((iVar1 + 0x191U < 2) && (local_88.add_error_location != 0)) {
          pcVar4 = coda_za_get_filename(zf);
          coda_add_error_message(" (in %s@",pcVar4);
          if (type == ze_product) {
            pcVar4 = "products/%s";
          }
          else if (type == ze_type) {
            pcVar4 = "types/%s";
          }
          else {
            pcVar4 = "index";
            name = (char *)0x0;
          }
          coda_add_error_message(pcVar4,name);
          XVar7 = coda_XML_GetCurrentLineNumber(local_88.parser);
          XVar8 = coda_XML_GetCurrentByteIndex(local_88.parser);
          coda_add_error_message(", line %lu, byte offset %ld)",XVar7,XVar8);
        }
      }
    }
    parser_info_delete(&local_88);
    return -1;
  }
  if (type == ze_product) {
    pcVar9 = coda_za_get_filename(zf);
    message = "invalid definition file \'%s\' (definition for product \'%s\' missing)";
  }
  else {
    if (type != ze_type) {
      pcVar9 = coda_za_get_filename(zf);
      coda_set_error(-400,"invalid definition file \'%s\' (index missing)",pcVar9);
      goto LAB_0012c9e5;
    }
    pcVar9 = coda_za_get_filename(zf);
    message = "invalid definition file \'%s\' (definition for type \'%s\' missing)";
  }
  coda_set_error(-400,message,pcVar9,name);
LAB_0012c9e5:
  free(pcVar4);
  return -1;
}

Assistant:

static int parse_entry(za_file *zf, zip_entry_type type, const char *name, coda_product_class *current_product_class,
                       coda_product_definition *current_product_definition)
{
    parser_info info;
    char *entry_name = NULL;
    za_entry *entry;
    long filesize;
    int result;
    int i;

    switch (type)
    {
        case ze_index:
            entry_name = strdup("index.xml");
            if (entry_name == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                               __LINE__);
            }
            break;
        case ze_type:
            assert(name != NULL);
            entry_name = malloc(6 + strlen(name) + 4 + 1);
            if (entry_name == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                               (long)6 + strlen(name) + 4 + 1, __FILE__, __LINE__);
            }
            sprintf(entry_name, "types/%s.xml", name);
            break;
        case ze_product:
            assert(name != NULL);
            entry_name = malloc(9 + strlen(name) + 4 + 1);
            if (entry_name == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                               (long)9 + strlen(name) + 4 + 1, __FILE__, __LINE__);
            }
            sprintf(entry_name, "products/%s.xml", name);
            break;
    }

    entry = za_get_entry_by_name(zf, entry_name);
    if (entry == NULL)
    {
        switch (type)
        {
            case ze_index:
                coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid definition file '%s' (index missing)",
                               za_get_filename(zf));
                break;
            case ze_type:
                coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid definition file '%s' "
                               "(definition for type '%s' missing)", za_get_filename(zf), name);
                break;
            case ze_product:
                coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid definition file '%s' "
                               "(definition for product '%s' missing)", za_get_filename(zf), name);
                break;
        }
        free(entry_name);
        return -1;
    }
    free(entry_name);

    parser_info_init(&info);
    info.zf = zf;
    info.entry_base_name = name;
    info.product_class = current_product_class;
    info.product_definition = current_product_definition;

    filesize = za_get_entry_size(entry);
    info.buffer = malloc(filesize);
    if (info.buffer == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)filesize, __FILE__, __LINE__);
        parser_info_delete(&info);
        return -1;
    }
    if (za_read_entry(entry, info.buffer) != 0)
    {
        parser_info_delete(&info);
        return -1;
    }

    info.hash_data = hashtable_new(1);
    if (info.hash_data == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate hashtable) (%s:%u)", __FILE__,
                       __LINE__);
        parser_info_delete(&info);
        return -1;
    }
    for (i = 0; i < num_xml_elements; i++)
    {
        if (hashtable_add_name(info.hash_data, xml_full_element_name[i]) != 0)
        {
            assert(0);
        }
    }

    info.parser = XML_ParserCreateNS(NULL, ' ');
    if (info.parser == NULL)
    {
        coda_set_error(CODA_ERROR_XML, "could not create XML parser");
        parser_info_delete(&info);
        return -1;
    }
    XML_SetUserData(info.parser, &info);
    XML_SetElementHandler(info.parser, start_element_handler, end_element_handler);
    push_node(&info, no_element, NULL);
    info.node->format_set = 0;
    switch (type)
    {
        case ze_index:
            register_sub_element(info.node, element_cd_product_class, cd_product_class_init,
                                 data_dictionary_add_product_class);
            break;
        case ze_type:
            register_type_elements(info.node, product_class_add_named_type);
            break;
        case ze_product:
            register_sub_element(info.node, element_cd_product_definition, cd_product_definition_sub_init, NULL);
            break;
    }

    coda_errno = 0;
    result = XML_Parse(info.parser, info.buffer, filesize, 1);
    if ((result == XML_STATUS_ERROR || coda_errno != 0) && !info.ignore_file)
    {
        if (coda_errno == 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "xml parse error: %s",
                           XML_ErrorString(XML_GetErrorCode(info.parser)));
        }
        if ((coda_errno == CODA_ERROR_DATA_DEFINITION || coda_errno == CODA_ERROR_EXPRESSION) &&
            info.add_error_location)
        {
            coda_add_error_message(" (in %s@", za_get_filename(zf));
            switch (type)
            {
                case ze_index:
                    coda_add_error_message("index", NULL);
                    break;
                case ze_type:
                    coda_add_error_message("types/%s", name);
                    break;
                case ze_product:
                    coda_add_error_message("products/%s", name);
                    break;
            }
            coda_add_error_message(", line %lu, byte offset %ld)", (long)XML_GetCurrentLineNumber(info.parser),
                                   (long)XML_GetCurrentByteIndex(info.parser));
        }
        parser_info_delete(&info);
        return -1;
    }
    parser_info_delete(&info);

    return 0;
}